

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabText.h
# Opt level: O3

char * tsGetTokenAlphaNumericExt
                 (char *pCurr,char *pEnd,char *ext_,char **resultStringBegin,uint32_t *stringLength)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  byte bVar4;
  uint32_t uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  
  pbVar3 = (byte *)pCurr;
  if (pCurr < pEnd) {
    do {
      pCurr = (char *)pbVar3;
      if ((0x20 < (ulong)(byte)*pCurr) || ((0x100002600U >> ((ulong)(byte)*pCurr & 0x3f) & 1) == 0))
      break;
      pbVar3 = (byte *)pCurr + 1;
      pCurr = pEnd;
    } while (pbVar3 != (byte *)pEnd);
  }
  *resultStringBegin = pCurr;
  *stringLength = 0;
  pbVar3 = (byte *)pCurr;
  if (pCurr < pEnd) {
    uVar5 = 0;
    do {
      bVar1 = *pCurr;
      if (((ulong)bVar1 < 0x21) && ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        return (char *)(byte *)pCurr;
      }
      bVar6 = (byte)(bVar1 - 0x30) < 10;
      bVar7 = (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a;
      bVar8 = bVar7 || bVar6;
      bVar4 = *ext_;
      if ((bVar4 != 0) && (pbVar3 = (byte *)(ext_ + 1), !bVar7 && !bVar6)) {
        do {
          bVar8 = bVar4 == bVar1;
          bVar2 = *pbVar3;
          if (bVar2 == 0) break;
          bVar6 = bVar4 != bVar1;
          pbVar3 = pbVar3 + 1;
          bVar4 = bVar2;
        } while (bVar6);
      }
      if (!bVar8) {
        return (char *)(byte *)pCurr;
      }
      pCurr = (char *)((byte *)pCurr + 1);
      uVar5 = uVar5 + 1;
      *stringLength = uVar5;
      pbVar3 = (byte *)pEnd;
    } while (pCurr != pEnd);
  }
  return (char *)pbVar3;
}

Assistant:

char const* tsGetTokenAlphaNumericExt(
    char const* pCurr, char const* pEnd,
    char const* ext_,
    char const** resultStringBegin, uint32_t* stringLength)
{
    Assert(pCurr && pEnd);

    pCurr = tsScanForNonWhiteSpace(pCurr, pEnd);
    *resultStringBegin = pCurr;
    *stringLength = 0;

    while (pCurr < pEnd)
    {
        char test = pCurr[0];

        if (tsIsWhiteSpace(test))
            break;

        _Bool accept = tsIsNumeric(test) || tsIsAlpha(test);
        char const* ext = ext_;
        for ( ; *ext && !accept; ++ext)
            accept |= *ext == test;

        if (!accept)
            break;

        ++pCurr;
        *stringLength += 1;
    }

    return pCurr;
}